

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O0

char * __thiscall CVmStringSource::read_line(CVmStringSource *this,char *buf,size_t len)

{
  long lVar1;
  char *pcVar2;
  char *dst;
  size_t len_local;
  char *buf_local;
  CVmStringSource *this_local;
  char *local_8;
  
  dst = buf;
  len_local = len;
  if (this->pos == this->memlen) {
    local_8 = (char *)0x0;
  }
  else {
    for (; this->pos < this->memlen && len_local != 0; len_local = len_local - 1) {
      if ((this->mem[this->pos] == '\n') || (this->mem[this->pos] == '\r')) {
        pcVar2 = dst + 1;
        *dst = '\n';
        len_local = len_local - 1;
        this->pos = this->pos + 1;
        dst = pcVar2;
        if ((this->pos < this->memlen) &&
           ((this->mem[this->pos + -1] == '\r' && (this->mem[this->pos] == '\n')))) {
          this->pos = this->pos + 1;
        }
        break;
      }
      lVar1 = this->pos;
      this->pos = lVar1 + 1;
      *dst = this->mem[lVar1];
      dst = dst + 1;
    }
    local_8 = buf;
    if (len_local != 0) {
      *dst = '\0';
    }
  }
  return local_8;
}

Assistant:

virtual char *read_line(char *buf, size_t len)
    {
        /* if we have no bytes left, return null for EOF */
        if (pos == memlen)
            return 0;
        
        /* read bytes until we encounter a CR, LF, or CR-LF */
        char *dst = buf;
        while (pos < memlen && len > 0)
        {
            /* check for a line terminator */
            if (mem[pos] == 10 || mem[pos] == 13)
            {
                /* 
                 *   add a newline to the result (it's always '\n' in the
                 *   result buffer regardless of the type of newline in the
                 *   source) 
                 */
                *dst++ = '\n';
                --len;

                /* 
                 *   if this is a CR-LF sequence, skip both characters;
                 *   otherwise just skip the single CR or LF
                 */
                ++pos;
                if (pos < memlen && mem[pos-1] == 13 && mem[pos] == 10)
                    ++pos;

                /* we're done */
                break;
            }

            /* copy this byte */
            *dst++ = mem[pos++];

            /* count it against the remaining buffer length */
            --len;
        }

        /* add a null terminator if possible */
        if (len != 0)
            *dst = '\0';

        /* return the original buffer pointer */
        return buf;
    }